

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void post_process_2pass(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  jpeg_d_post_controller *pjVar1;
  uint uVar2;
  JSAMPARRAY ppJVar3;
  uint local_44;
  JDIMENSION max_rows;
  JDIMENSION num_rows;
  my_post_ptr post;
  JDIMENSION *out_row_ctr_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION in_row_groups_avail_local;
  JDIMENSION *in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->post;
  if (*(int *)&pjVar1[2].post_process_data == 0) {
    ppJVar3 = (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)pjVar1[1].start_pass,
                         *(JDIMENSION *)((long)&pjVar1[2].start_pass + 4),
                         *(JDIMENSION *)&pjVar1[2].start_pass,0);
    pjVar1[1].post_process_data =
         (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
          *)ppJVar3;
  }
  local_44 = *(int *)&pjVar1[2].start_pass - *(int *)&pjVar1[2].post_process_data;
  if (out_rows_avail - *out_row_ctr < local_44) {
    local_44 = out_rows_avail - *out_row_ctr;
  }
  uVar2 = cinfo->output_height - *(int *)((long)&pjVar1[2].start_pass + 4);
  if (uVar2 < local_44) {
    local_44 = uVar2;
  }
  (*cinfo->cquantize->color_quantize)
            (cinfo,(JSAMPARRAY)
                   (pjVar1[1].post_process_data + (ulong)*(uint *)&pjVar1[2].post_process_data * 8),
             output_buf + *out_row_ctr,local_44);
  *out_row_ctr = local_44 + *out_row_ctr;
  *(uint *)&pjVar1[2].post_process_data = local_44 + *(int *)&pjVar1[2].post_process_data;
  if (*(uint *)&pjVar1[2].start_pass <= *(uint *)&pjVar1[2].post_process_data) {
    *(int *)((long)&pjVar1[2].start_pass + 4) =
         *(int *)&pjVar1[2].start_pass + *(int *)((long)&pjVar1[2].start_pass + 4);
    *(undefined4 *)&pjVar1[2].post_process_data = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
post_process_2pass (j_decompress_ptr cinfo,
		    JSAMPIMAGE input_buf, JDIMENSION *in_row_group_ctr,
		    JDIMENSION in_row_groups_avail,
		    JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
		    JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr) cinfo->post;
  JDIMENSION num_rows, max_rows;

  /* Reposition virtual buffer if at start of strip. */
  if (post->next_row == 0) {
    post->buffer = (*cinfo->mem->access_virt_sarray)
	((j_common_ptr) cinfo, post->whole_image,
	 post->starting_row, post->strip_height, FALSE);
  }

  /* Determine number of rows to emit. */
  num_rows = post->strip_height - post->next_row; /* available in strip */
  max_rows = out_rows_avail - *out_row_ctr; /* available in output area */
  if (num_rows > max_rows)
    num_rows = max_rows;
  /* We have to check bottom of image here, can't depend on upsampler. */
  max_rows = cinfo->output_height - post->starting_row;
  if (num_rows > max_rows)
    num_rows = max_rows;

  /* Quantize and emit data. */
  (*cinfo->cquantize->color_quantize) (cinfo,
		post->buffer + post->next_row, output_buf + *out_row_ctr,
		(int) num_rows);
  *out_row_ctr += num_rows;

  /* Advance if we filled the strip. */
  post->next_row += num_rows;
  if (post->next_row >= post->strip_height) {
    post->starting_row += post->strip_height;
    post->next_row = 0;
  }
}